

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliques.cpp
# Opt level: O3

void bron_kerbosch(set<int,_std::less<int>,_std::allocator<int>_> *R,
                  set<int,_std::less<int>,_std::allocator<int>_> *P,
                  set<int,_std::less<int>,_std::allocator<int>_> *X)

{
  _Base_ptr p_Var1;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar2;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> newX;
  set<int,_std::less<int>,_std::allocator<int>_> newP;
  set<int,_std::less<int>,_std::allocator<int>_> newR;
  set<int,_std::less<int>,_std::allocator<int>_> foriterate;
  _Rb_tree_color local_1a4;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_1a0;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_198;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_190;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_188;
  _Rb_tree_header *local_180;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_178;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_148;
  _Rb_tree_const_iterator<int> local_118;
  undefined4 local_110 [2];
  undefined8 local_108;
  undefined4 *local_100;
  undefined4 *local_f8;
  undefined8 local_f0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_e8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_b8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_88;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_58;
  
  local_190 = &R->_M_t;
  if (((P->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     ((X->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    local_e8._M_impl._0_8_ = (R->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_118._M_node = &(R->_M_t)._M_impl.super__Rb_tree_header._M_header;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&(anonymous_namespace)::cliques,(_Rb_tree_const_iterator<int> *)&local_e8,
               &local_118);
  }
  else {
    local_1a0 = &P->_M_t;
    local_198 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)X;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_e8,&P->_M_t);
    if (local_e8._M_impl.super__Rb_tree_header._M_header._M_left !=
        (_Rb_tree_node_base *)((long)&local_e8 + 8U)) {
      local_180 = &(((_Rep_type *)&local_1a0->_M_impl)->_M_impl).super__Rb_tree_header;
      local_188 = local_198 + 8;
      p_Var1 = local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_1a4 = p_Var1[1]._M_color;
        local_110[0] = 0;
        local_108 = 0;
        local_100 = local_110;
        local_f0 = 0;
        local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_148._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_148._M_impl.super__Rb_tree_header._M_header;
        local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_178._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_178._M_impl.super__Rb_tree_header._M_header;
        local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_178._M_impl.super__Rb_tree_header._M_header._M_right =
             local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        local_148._M_impl.super__Rb_tree_header._M_header._M_right =
             local_148._M_impl.super__Rb_tree_header._M_header._M_left;
        local_f8 = local_100;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &local_118,local_190);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_118,(int *)&local_1a4);
        std::
        __set_intersection<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((((_Rep_type *)&local_1a0->_M_impl)->_M_impl).super__Rb_tree_header._M_header.
                   _M_left,local_180,
                   edge.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)local_1a4].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,edge.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)local_1a4].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_148,
                   local_148._M_impl.super__Rb_tree_header._M_header._M_left);
        std::
        __set_intersection<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (*(_Base_ptr *)(local_198 + 0x18),local_188,
                   edge.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)local_1a4].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,edge.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)local_1a4].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_178,
                   local_178._M_impl.super__Rb_tree_header._M_header._M_left);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                  (&local_b8,
                   (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &local_118);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                  (&local_58,&local_148);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                  (&local_88,&local_178);
        bron_kerbosch((set<int,_std::less<int>,_std::allocator<int>_> *)&local_b8,
                      (set<int,_std::less<int>,_std::allocator<int>_> *)&local_58,
                      (set<int,_std::less<int>,_std::allocator<int>_> *)&local_88);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_88);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_58);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_b8);
        pVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                equal_range(local_1a0,(key_type *)&local_1a4);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_erase_aux(local_1a0,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_198,(int *)&local_1a4);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_178);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_148);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &local_118);
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      } while (p_Var1 != (_Rb_tree_node_base *)((long)&local_e8 + 8U));
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_e8);
  }
  return;
}

Assistant:

void bron_kerbosch(set <int> R, set <int> P, set <int> X) { // where R is probable clique, P - possible vertices in clique, X - exluded vertices
    if (P.empty() && X.empty()) { // R is maximal clique
        cliques.emplace_back(R.begin(), R.end());
    }
    else {
        set <int> foriterate = P;
        for (auto i : foriterate) {
            set <int> newR;
            set <int> newP;
            set <int> newX;

            newR = R;
            newR.insert(i);

            set_intersection(P.begin(), P.end(), edge[i].begin(), edge[i].end(), inserter(newP, newP.begin()));

            set_intersection(X.begin(), X.end(), edge[i].begin(), edge[i].end(), inserter(newX, newX.begin()));

            bron_kerbosch(newR, newP, newX);

            P.erase(i);
            X.insert(i);
        }
    }
}